

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

FILE * pugi::impl::anon_unknown_0::open_file_wide(wchar_t *path,wchar_t *mode)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  wchar_t wVar21;
  long lVar22;
  char *buffer;
  FILE *pFVar23;
  ulong uVar24;
  size_t size;
  ulong uVar25;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 in_ZMM8 [64];
  char mode_ascii [4];
  char local_2c [4];
  undefined1 auVar26 [32];
  
  if (path == (wchar_t *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x1375,
                  "char *pugi::impl::(anonymous namespace)::convert_path_heap(const wchar_t *)");
  }
  lVar22 = -4;
  do {
    lVar35 = lVar22 + 4;
    lVar22 = lVar22 + 4;
  } while (*(int *)((long)path + lVar35) != 0);
  if (lVar22 == 0) {
    size = 0;
  }
  else {
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar28._8_4_ = 0xffff;
    auVar28._0_8_ = 0xffff0000ffff;
    auVar28._12_4_ = 0xffff;
    auVar28._16_4_ = 0xffff;
    auVar28._20_4_ = 0xffff;
    auVar28._24_4_ = 0xffff;
    auVar28._28_4_ = 0xffff;
    auVar42._8_4_ = 0x80;
    auVar42._0_8_ = 0x8000000080;
    auVar42._12_4_ = 0x80;
    auVar42._16_4_ = 0x80;
    auVar42._20_4_ = 0x80;
    auVar42._24_4_ = 0x80;
    auVar42._28_4_ = 0x80;
    auVar43._8_4_ = 0x800;
    auVar43._0_8_ = 0x80000000800;
    auVar43._12_4_ = 0x800;
    auVar43._16_4_ = 0x800;
    auVar43._20_4_ = 0x800;
    auVar43._24_4_ = 0x800;
    auVar43._28_4_ = 0x800;
    auVar30 = vpbroadcastq_avx512f(ZEXT816(3));
    auVar44 = ZEXT1664((undefined1  [16])0x0);
    auVar31 = vpbroadcastq_avx512f();
    uVar24 = 0;
    do {
      auVar32 = vpbroadcastq_avx512f();
      auVar33 = vmovdqa64_avx512f(auVar44);
      auVar44 = vporq_avx512f(auVar32,auVar29);
      uVar20 = vpcmpuq_avx512f(auVar44,auVar31,2);
      auVar26 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(path + uVar24));
      auVar27._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar26._4_4_;
      auVar27._0_4_ = (uint)((byte)uVar20 & 1) * auVar26._0_4_;
      auVar27._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar26._8_4_;
      auVar27._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar26._12_4_;
      auVar27._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar26._16_4_;
      auVar27._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar26._20_4_;
      auVar27._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar26._24_4_;
      auVar27._28_4_ = (uint)(byte)(uVar20 >> 7) * auVar26._28_4_;
      uVar24 = uVar24 + 8;
      uVar18 = vpcmpud_avx512vl(auVar27,auVar43,1);
      auVar44._8_8_ = 2;
      auVar44._0_8_ = 2;
      auVar44._16_8_ = 2;
      auVar44._24_8_ = 2;
      auVar44._32_8_ = 2;
      auVar44._40_8_ = 2;
      auVar44._48_8_ = 2;
      auVar44._56_8_ = 2;
      auVar44 = vpblendmq_avx512f(auVar30,auVar44);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar4 = (bool)((byte)(uVar18 >> 1) & 1);
      lVar35 = in_ZMM8._8_8_;
      bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
      lVar36 = in_ZMM8._16_8_;
      bVar8 = (bool)((byte)(uVar18 >> 3) & 1);
      lVar37 = in_ZMM8._24_8_;
      bVar10 = (bool)((byte)(uVar18 >> 4) & 1);
      lVar38 = in_ZMM8._32_8_;
      bVar12 = (bool)((byte)(uVar18 >> 5) & 1);
      lVar39 = in_ZMM8._40_8_;
      bVar14 = (bool)((byte)(uVar18 >> 6) & 1);
      lVar40 = in_ZMM8._48_8_;
      lVar41 = in_ZMM8._56_8_;
      uVar19 = vpcmpud_avx512vl(auVar27,auVar42,1);
      uVar25 = vpcmpud_avx512vl(auVar27,auVar28,6);
      uVar25 = uVar20 & uVar25;
      auVar32 = vpbroadcastq_avx512f(ZEXT816(1));
      bVar2 = (bool)((byte)uVar19 & 1);
      bVar5 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar34 = vpbroadcastq_avx512f(ZEXT816(4));
      bVar3 = (bool)((byte)uVar25 & 1);
      in_ZMM8._0_8_ =
           (ulong)bVar3 * auVar34._0_8_ |
           (ulong)!bVar3 *
           ((ulong)bVar2 * auVar32._0_8_ |
           (ulong)!bVar2 * ((ulong)bVar1 * auVar44._0_8_ | (ulong)!bVar1 * in_ZMM8._0_8_));
      bVar1 = (bool)((byte)(uVar25 >> 1) & 1);
      in_ZMM8._8_8_ =
           (ulong)bVar1 * auVar34._8_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar5 * auVar32._8_8_ |
           (ulong)!bVar5 * ((ulong)bVar4 * auVar44._8_8_ | (ulong)!bVar4 * lVar35));
      bVar1 = (bool)((byte)(uVar25 >> 2) & 1);
      in_ZMM8._16_8_ =
           (ulong)bVar1 * auVar34._16_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar7 * auVar32._16_8_ |
           (ulong)!bVar7 * ((ulong)bVar6 * auVar44._16_8_ | (ulong)!bVar6 * lVar36));
      bVar1 = (bool)((byte)(uVar25 >> 3) & 1);
      in_ZMM8._24_8_ =
           (ulong)bVar1 * auVar34._24_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar9 * auVar32._24_8_ |
           (ulong)!bVar9 * ((ulong)bVar8 * auVar44._24_8_ | (ulong)!bVar8 * lVar37));
      bVar1 = (bool)((byte)(uVar25 >> 4) & 1);
      in_ZMM8._32_8_ =
           (ulong)bVar1 * auVar34._32_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar11 * auVar32._32_8_ |
           (ulong)!bVar11 * ((ulong)bVar10 * auVar44._32_8_ | (ulong)!bVar10 * lVar38));
      bVar1 = (bool)((byte)(uVar25 >> 5) & 1);
      in_ZMM8._40_8_ =
           (ulong)bVar1 * auVar34._40_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar13 * auVar32._40_8_ |
           (ulong)!bVar13 * ((ulong)bVar12 * auVar44._40_8_ | (ulong)!bVar12 * lVar39));
      bVar1 = (bool)((byte)(uVar25 >> 6) & 1);
      in_ZMM8._48_8_ =
           (ulong)bVar1 * auVar34._48_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar15 * auVar32._48_8_ |
           (ulong)!bVar15 * ((ulong)bVar14 * auVar44._48_8_ | (ulong)!bVar14 * lVar40));
      in_ZMM8._56_8_ =
           (uVar25 >> 7) * auVar34._56_8_ |
           (ulong)!SUB81(uVar25 >> 7,0) *
           ((uVar19 >> 7) * auVar32._56_8_ |
           (ulong)!SUB81(uVar19 >> 7,0) *
           ((uVar18 >> 7) * auVar44._56_8_ | (ulong)!SUB81(uVar18 >> 7,0) * lVar41));
      auVar44 = vpaddq_avx512f(auVar33,in_ZMM8);
    } while (((lVar22 >> 2) + 7U & 0xfffffffffffffff8) != uVar24);
    auVar29 = vmovdqa64_avx512f(auVar44);
    bVar1 = (bool)((byte)uVar20 & 1);
    auVar30._0_8_ = (ulong)bVar1 * auVar29._0_8_ | (ulong)!bVar1 * auVar33._0_8_;
    bVar1 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar30._8_8_ = (ulong)bVar1 * auVar29._8_8_ | (ulong)!bVar1 * auVar33._8_8_;
    bVar1 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar30._16_8_ = (ulong)bVar1 * auVar29._16_8_ | (ulong)!bVar1 * auVar33._16_8_;
    bVar1 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar30._24_8_ = (ulong)bVar1 * auVar29._24_8_ | (ulong)!bVar1 * auVar33._24_8_;
    bVar1 = (bool)((byte)(uVar20 >> 4) & 1);
    auVar30._32_8_ = (ulong)bVar1 * auVar29._32_8_ | (ulong)!bVar1 * auVar33._32_8_;
    bVar1 = (bool)((byte)(uVar20 >> 5) & 1);
    auVar30._40_8_ = (ulong)bVar1 * auVar29._40_8_ | (ulong)!bVar1 * auVar33._40_8_;
    bVar1 = (bool)((byte)(uVar20 >> 6) & 1);
    auVar30._48_8_ = (ulong)bVar1 * auVar29._48_8_ | (ulong)!bVar1 * auVar33._48_8_;
    auVar30._56_8_ = (uVar20 >> 7) * auVar29._56_8_ | (ulong)!SUB81(uVar20 >> 7,0) * auVar33._56_8_;
    auVar28 = vextracti64x4_avx512f(auVar30,1);
    auVar29 = vpaddq_avx512f(auVar30,ZEXT3264(auVar28));
    auVar16 = vpaddq_avx(auVar29._0_16_,auVar29._16_16_);
    auVar17 = vpshufd_avx(auVar16,0xee);
    auVar16 = vpaddq_avx(auVar16,auVar17);
    size = auVar16._0_8_;
  }
  buffer = (char *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(size + 1);
  if (buffer == (char *)0x0) {
    pFVar23 = (FILE *)0x0;
  }
  else {
    as_utf8_end(buffer,size,path,lVar22 >> 2);
    buffer[size] = '\0';
    local_2c[0] = '\0';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    wVar21 = *mode;
    if (wVar21 != L'\0') {
      lVar22 = 0;
      do {
        local_2c[lVar22] = (char)wVar21;
        wVar21 = mode[lVar22 + 1];
        lVar22 = lVar22 + 1;
      } while (wVar21 != L'\0');
    }
    pFVar23 = fopen(buffer,local_2c);
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (buffer);
  }
  return (FILE *)pFVar23;
}

Assistant:

PUGI__FN char* convert_path_heap(const wchar_t* str)
	{
		assert(str);

		// first pass: get length in utf8 characters
		size_t length = strlength_wide(str);
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		char* result = static_cast<char*>(xml_memory::allocate(size + 1));
		if (!result) return 0;

		// second pass: convert to utf8
		as_utf8_end(result, size, str, length);

		// zero-terminate
		result[size] = 0;

		return result;
	}